

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,char *filename,bool compact)

{
  XMLError XVar1;
  FILE *__stream;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    this->_errorID = XML_ERROR_FILE_COULD_NOT_BE_OPENED;
    this->_errorStr1 = filename;
    this->_errorStr2 = (char *)0x0;
    XVar1 = XML_ERROR_FILE_COULD_NOT_BE_OPENED;
  }
  else {
    SaveFile(this,(FILE *)__stream,compact);
    fclose(__stream);
    XVar1 = this->_errorID;
  }
  return XVar1;
}

Assistant:

XMLError XMLDocument::SaveFile( const char* filename, bool compact )
{
    FILE* fp = callfopen( filename, "w" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_COULD_NOT_BE_OPENED, filename, 0 );
        return _errorID;
    }
    SaveFile(fp, compact);
    fclose( fp );
    return _errorID;
}